

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::error::CodeEnumToString_abi_cxx11_
          (string *__return_storage_ptr__,error *this,Code code)

{
  char *pcVar1;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "OK";
    break;
  case 1:
    pcVar1 = "CANCELLED";
    break;
  default:
    pcVar1 = "UNKNOWN";
    break;
  case 3:
    pcVar1 = "INVALID_ARGUMENT";
    break;
  case 4:
    pcVar1 = "DEADLINE_EXCEEDED";
    break;
  case 5:
    pcVar1 = "NOT_FOUND";
    break;
  case 6:
    pcVar1 = "ALREADY_EXISTS";
    break;
  case 7:
    pcVar1 = "PERMISSION_DENIED";
    break;
  case 8:
    pcVar1 = "RESOURCE_EXHAUSTED";
    break;
  case 9:
    pcVar1 = "FAILED_PRECONDITION";
    break;
  case 10:
    pcVar1 = "ABORTED";
    break;
  case 0xb:
    pcVar1 = "OUT_OF_RANGE";
    break;
  case 0xc:
    pcVar1 = "UNIMPLEMENTED";
    break;
  case 0xd:
    pcVar1 = "INTERNAL";
    break;
  case 0xe:
    pcVar1 = "UNAVAILABLE";
    break;
  case 0xf:
    pcVar1 = "DATA_LOSS";
    break;
  case 0x10:
    pcVar1 = "UNAUTHENTICATED";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

inline string CodeEnumToString(error::Code code) {
  switch (code) {
    case OK:
      return "OK";
    case CANCELLED:
      return "CANCELLED";
    case UNKNOWN:
      return "UNKNOWN";
    case INVALID_ARGUMENT:
      return "INVALID_ARGUMENT";
    case DEADLINE_EXCEEDED:
      return "DEADLINE_EXCEEDED";
    case NOT_FOUND:
      return "NOT_FOUND";
    case ALREADY_EXISTS:
      return "ALREADY_EXISTS";
    case PERMISSION_DENIED:
      return "PERMISSION_DENIED";
    case UNAUTHENTICATED:
      return "UNAUTHENTICATED";
    case RESOURCE_EXHAUSTED:
      return "RESOURCE_EXHAUSTED";
    case FAILED_PRECONDITION:
      return "FAILED_PRECONDITION";
    case ABORTED:
      return "ABORTED";
    case OUT_OF_RANGE:
      return "OUT_OF_RANGE";
    case UNIMPLEMENTED:
      return "UNIMPLEMENTED";
    case INTERNAL:
      return "INTERNAL";
    case UNAVAILABLE:
      return "UNAVAILABLE";
    case DATA_LOSS:
      return "DATA_LOSS";
  }

  // No default clause, clang will abort if a code is missing from
  // above switch.
  return "UNKNOWN";
}